

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DetectorOutput.h
# Opt level: O0

void __thiscall DetectorOutput::~DetectorOutput(DetectorOutput *this)

{
  bool bVar1;
  pointer pDVar2;
  pointer ppVar3;
  _Node_iterator_base<std::pair<const_unsigned_int,_void_**>,_false> local_20;
  _Node_iterator_base<std::pair<const_unsigned_int,_void_**>,_false> local_18;
  iterator it;
  DetectorOutput *this_local;
  
  it.super__Node_iterator_base<std::pair<const_unsigned_int,_void_**>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_unsigned_int,_void_**>,_false>)
       (_Node_iterator_base<std::pair<const_unsigned_int,_void_**>,_false>)this;
  pDVar2 = std::unique_ptr<Detector,_std::default_delete<Detector>_>::operator->(&this->_det);
  (**(code **)(*(long *)pDVar2 + 0x20))();
  local_18._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_void_**,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_void_**>_>_>
       ::begin(&this->tls);
  while( true ) {
    local_20._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_void_**,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_void_**>_>_>
         ::end(&this->tls);
    bVar1 = std::__detail::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppVar3 = std::__detail::_Node_iterator<std::pair<const_unsigned_int,_void_**>,_false,_false>::
             operator->((_Node_iterator<std::pair<const_unsigned_int,_void_**>,_false,_false> *)
                        &local_18);
    if (ppVar3->second != (void **)0x0) {
      operator_delete(ppVar3->second,8);
    }
    std::__detail::_Node_iterator<std::pair<const_unsigned_int,_void_**>,_false,_false>::operator++
              ((_Node_iterator<std::pair<const_unsigned_int,_void_**>,_false,_false> *)&local_18,0);
  }
  std::operator<<((ostream *)&std::cout,"finished ");
  std::unique_ptr<Detector,_std::default_delete<Detector>_>::~unique_ptr(&this->_det);
  std::shared_ptr<util::LibraryLoader>::~shared_ptr(&this->_libdetector);
  std::
  unordered_map<unsigned_int,_void_**,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_void_**>_>_>
  ::~unordered_map(&this->tls);
  return;
}

Assistant:

~DetectorOutput() {
    _det->finalize();
    for (auto it = tls.begin(); it != tls.end(); it++) {
      delete it->second;
    }
    std::cout << "finished ";
  }